

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irExpression *
build_ir_call(Context_conflict *ctx,MOJOSHADER_astExpressionCallFunction *ast)

{
  MOJOSHADER_astDataTypeType type_00;
  int index;
  int elements;
  MOJOSHADER_astDataType *dt_00;
  MOJOSHADER_astDataType *pMVar1;
  MOJOSHADER_irExprList *args;
  MOJOSHADER_irExpression *pMVar2;
  int elems;
  MOJOSHADER_astDataTypeType type;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astExpressionCallFunction *ast_local;
  Context_conflict *ctx_local;
  
  dt_00 = reduce_datatype(ctx,ast->datatype);
  pMVar1 = datatype_base(ctx,dt_00);
  type_00 = pMVar1->type;
  elements = datatype_elems(ctx,dt_00);
  index = ast->identifier->index;
  args = build_ir_exprlist(ctx,ast->args);
  pMVar2 = new_ir_call(ctx,index,args,type_00,elements);
  return pMVar2;
}

Assistant:

static MOJOSHADER_irExpression *build_ir_call(Context *ctx, const MOJOSHADER_astExpressionCallFunction *ast)
{
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->datatype);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    return new_ir_call(ctx, ast->identifier->index, build_ir_exprlist(ctx, ast->args), type, elems);
}